

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile.c
# Opt level: O0

int big_block_seek(BigBlock *bb,BigBlockPtr *ptr,ptrdiff_t offset)

{
  int iVar1;
  int iVar2;
  int local_30;
  int mid;
  int right;
  int left;
  ptrdiff_t offset_local;
  BigBlockPtr *ptr_local;
  BigBlock *bb_local;
  
  if ((bb->size == 0) && (offset == 0)) {
    ptr->fileid = 0;
    ptr->roffset = 0;
    ptr->aoffset = 0;
    bb_local._4_4_ = 0;
  }
  else {
    _right = offset;
    if (offset < 0) {
      _right = bb->foffset[bb->Nfile] + offset;
    }
    if (bb->size < _right) {
      _big_file_raise("Over the end of file %td of %td",
                      "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile.c"
                      ,0x2c8,_right,bb->size);
      bb_local._4_4_ = -1;
    }
    else {
      mid = 0;
      iVar1 = bb->Nfile;
      while (local_30 = iVar1, mid + 1 < local_30) {
        iVar2 = (local_30 - mid >> 1) + mid;
        iVar1 = iVar2;
        if (bb->foffset[iVar2] <= _right) {
          iVar1 = local_30;
          mid = iVar2;
        }
      }
      ptr->fileid = mid;
      ptr->roffset = _right - bb->foffset[mid];
      ptr->aoffset = _right;
      bb_local._4_4_ = 0;
    }
  }
  return bb_local._4_4_;
}

Assistant:

int
big_block_seek(BigBlock * bb, BigBlockPtr * ptr, ptrdiff_t offset)
{
    /* handle 0 sized files */
    if(bb->size == 0 && offset == 0) {
        ptr->fileid = 0;
        ptr->roffset = 0;
        ptr->aoffset = 0;
        return 0;
    }
    /* handle negatives */
    if(offset < 0) offset += bb->foffset[bb->Nfile];

    RAISEIF(offset > bb->size, 
            ex_eof,
        /* over the end of file */
        /* note that we allow seeking at the end of file */
            "Over the end of file %td of %td",
            offset, bb->size);
    {
        int left = 0;
        int right = bb->Nfile;
        while(right > left + 1) {
            int mid = ((right - left) >> 1) + left;
            if(bb->foffset[mid] <= offset) {
                left = mid;
            } else {
                right = mid;
            }
        }
        ptr->fileid = left;
        ptr->roffset = offset - bb->foffset[left];
        ptr->aoffset = offset;
        return 0;
    }
ex_eof:
    return -1;
}